

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * intersect(string *__return_storage_ptr__,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *s1,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *s2)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  intersect;
  allocator local_39;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((s1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(s1->_M_t)._M_impl.super__Rb_tree_header,
             (s2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(s2->_M_t)._M_impl.super__Rb_tree_header,&local_38);
  if (local_38._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)(local_38._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string intersect(const std::set<std::string>& s1,
                             const std::set<std::string>& s2)
{
  std::set<std::string> intersect;
  std::set_intersection(s1.begin(), s1.end(), s2.begin(), s2.end(),
                        std::inserter(intersect, intersect.begin()));
  if (!intersect.empty()) {
    return *intersect.begin();
  }
  return "";
}